

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O1

void __thiscall
PngInput::readImage(PngInput *this,void *bufferOut,size_t bufferOutByteCount,uint32_t param_3,
                   uint32_t param_4,FormatDescriptor *format)

{
  ushort *puVar1;
  uint w;
  uint h;
  uint uVar2;
  FormatDescriptor *pFVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  size_t i;
  ulong uVar10;
  long lVar11;
  runtime_error *prVar12;
  int iVar13;
  pointer pcVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  idat_in;
  uint uVar18;
  uint uVar19;
  FormatDescriptor *this_00;
  uint uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 auVar37 [16];
  long lVar40;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string local_a8;
  string local_88;
  char *local_68;
  char *local_58;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_48;
  
  pFVar3 = *(FormatDescriptor **)&(this->super_ImageInput).images;
  this_00 = format;
  if ((format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_00 = pFVar3;
  }
  uVar20 = (this_00->extended).channelCount;
  w = *(uint *)&pFVar3[1].basic;
  h = *(uint *)&pFVar3[1].basic.field_0x4;
  uVar7 = FormatDescriptor::largestChannelBitLength(this_00);
  iVar13 = 0;
  do {
    uVar21 = 1 << ((byte)iVar13 & 0x1f);
    if (uVar7 - 1 < uVar21) goto LAB_0014df6f;
    iVar13 = iVar13 + 1;
  } while (iVar13 != 0x20);
  uVar21 = 0;
LAB_0014df6f:
  pcVar14 = (pointer)0x8;
  if (8 < uVar21) {
    pcVar14 = (pointer)(ulong)uVar21;
  }
  uVar8 = (uint)pcVar14;
  if ((uVar8 != 8) && (uVar8 != 0x10)) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    fmt_02.size_ = 2;
    fmt_02.data_ = (char *)0x47;
    args_02.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)format;
    args_02.desc_ = (unsigned_long_long)&local_a8;
    local_a8._M_dataplus._M_p = pcVar14;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_88,
               (v10 *)"PNG decode error: Requested decode into {}-bit format is not supported.",
               fmt_02,args_02);
    std::runtime_error::runtime_error(prVar12,(string *)&local_88);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar10 = *(ulong *)(this_00->samples).
                     super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar10 & 0xf0000000) != 0) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar20 = (uint)uVar10;
    local_88.field_2._M_allocated_capacity = (size_type)" Linear";
    if ((uVar20 >> 0x1c & 1) == 0) {
      local_88.field_2._M_allocated_capacity = (size_type)"";
    }
    local_68 = " Exponent";
    if ((uVar20 >> 0x1d & 1) == 0) {
      local_68 = "";
    }
    local_58 = " Signed";
    if ((uVar20 >> 0x1e & 1) == 0) {
      local_58 = "";
    }
    local_48.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x18e76c;
    if (-1 < (int)uVar20) {
      local_48.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x18f550;
    }
    fmt.size_ = 0xcccc2;
    fmt.data_ = (char *)0x51;
    args.field_1.values_ = local_48.values_;
    args.desc_ = (unsigned_long_long)&local_88;
    local_88._M_dataplus._M_p = pcVar14;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a8,
               (v10 *)
               "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.",
               fmt,args);
    std::runtime_error::runtime_error(prVar12,(string *)&local_a8);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (this->state).super_LodePNGState.info_raw.bitdepth = uVar8;
  uVar8 = (this_00->extended).channelCount - 1;
  if (3 < uVar8) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = (pointer)(ulong)(this_00->extended).channelCount;
    fmt_00.size_ = 2;
    fmt_00.data_ = (char *)0x45;
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)format;
    args_00.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_88,
               (v10 *)"PNG decode error: Requested decode into {} channels is not supported.",fmt_00
               ,args_00);
    std::runtime_error::runtime_error(prVar12,(string *)&local_88);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (this->state).super_LodePNGState.info_raw.colortype =
       *(LodePNGColorType *)(&DAT_00192050 + (ulong)uVar8 * 4);
  idat_in = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
             )this->pIdat;
  uVar8 = lodepng_finish_decode
                    ((uchar *)bufferOut,bufferOutByteCount,w,h,&(this->state).super_LodePNGState,
                     idat_in.values_,this->idatsize);
  if (uVar8 != 0) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = lodepng_error_text(uVar8);
    fmt_01.size_ = 0xc;
    fmt_01.data_ = (char *)0x15;
    args_01.field_1.values_ = idat_in.values_;
    args_01.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"PNG decode error: {}.",fmt_01,args_01);
    std::runtime_error::runtime_error(prVar12,(string *)&local_88);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (bufferOutByteCount != 0 && uVar21 == 0x10) {
    uVar10 = 0;
    do {
      puVar1 = (ushort *)((long)bufferOut + uVar10);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      uVar10 = uVar10 + 2;
    } while (uVar10 < bufferOutByteCount);
  }
  auVar6 = _DAT_00181500;
  auVar5 = _DAT_001814f0;
  if ((this->state).super_LodePNGState.info_png.sbit_defined != 0) {
    local_88._M_dataplus._M_p = *(pointer *)&(this->state).super_LodePNGState.info_png.sbit_r;
    local_88._M_string_length._0_4_ = (this->state).super_LodePNGState.info_png.sbit_b;
    local_88._M_string_length._4_4_ = (this->state).super_LodePNGState.info_png.sbit_a;
    if (h != 0) {
      uVar8 = 0;
      do {
        if (w != 0) {
          uVar19 = 0;
          do {
            if ((ulong)uVar20 != 0) {
              uVar10 = 0;
              do {
                uVar17 = (ulong)((uVar19 + uVar8 * w) * uVar20 + (int)uVar10);
                uVar2 = *(uint *)((long)&local_88._M_dataplus._M_p + uVar10 * 4);
                uVar16 = CONCAT44(0,uVar2);
                bVar15 = (byte)uVar2;
                if (uVar21 < 9) {
                  if (0x1f < uVar2 - 1) {
LAB_0014e3e5:
                    __assert_fail("sourceBits > 0 && sourceBits <= 32",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                  ,0xee,
                                  "uint32_t imageio::convertUNORM(uint32_t, uint32_t, uint32_t)");
                  }
                  uVar18 = ~(-1 << (bVar15 & 0x1f)) &
                           (uint)(*(byte *)((long)bufferOut + uVar17) >> (8 - bVar15 & 0x1f));
                  uVar9 = uVar18;
                  if (uVar16 != 8) {
                    if (uVar2 < 9) {
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = uVar16;
                      auVar4 = (ZEXT816(0) << 0x40 | ZEXT816(7)) / auVar4;
                      iVar13 = auVar4._0_4_;
                      auVar37 = ZEXT416(uVar2) << 0x40;
                      auVar22._0_8_ = auVar4._0_8_;
                      auVar22._8_4_ = iVar13;
                      auVar22._12_4_ = 0;
                      lVar11 = 2;
                      auVar26 = (undefined1  [16])0x0;
                      do {
                        auVar30 = auVar26;
                        lVar40 = auVar37._8_8_;
                        auVar26._0_8_ =
                             ((ulong)uVar18 << (8U - auVar37._0_8_ & 0xffffffff)) >> uVar16;
                        auVar26._8_8_ = ((ulong)uVar18 << (8U - lVar40 >> 0x20)) >> uVar16;
                        auVar26 = auVar26 | auVar30;
                        auVar37._0_8_ = auVar37._0_8_ + (ulong)uVar2 * 2;
                        auVar37._8_8_ = lVar40 + (ulong)uVar2 * 2;
                        lVar40 = (ulong)(iVar13 + 2U & 0xe) + lVar11;
                        lVar11 = lVar11 + -2;
                      } while (lVar40 != 4);
                      lVar11 = -lVar11;
                      auVar27._8_4_ = (int)lVar11;
                      auVar27._0_8_ = lVar11;
                      auVar27._12_4_ = (int)((ulong)lVar11 >> 0x20);
                      auVar22 = auVar22 ^ auVar6;
                      auVar28 = (auVar27 | auVar5) ^ auVar6;
                      iVar13 = -(uint)(auVar22._0_4_ < auVar28._0_4_);
                      iVar34 = -(uint)(auVar22._4_4_ < auVar28._4_4_);
                      iVar35 = -(uint)(auVar22._8_4_ < auVar28._8_4_);
                      iVar36 = -(uint)(auVar22._12_4_ < auVar28._12_4_);
                      auVar38._4_4_ = iVar13;
                      auVar38._0_4_ = iVar13;
                      auVar38._8_4_ = iVar35;
                      auVar38._12_4_ = iVar35;
                      iVar13 = -(uint)(auVar28._4_4_ == auVar22._4_4_);
                      iVar35 = -(uint)(auVar28._12_4_ == auVar22._12_4_);
                      auVar23._4_4_ = iVar13;
                      auVar23._0_4_ = iVar13;
                      auVar23._8_4_ = iVar35;
                      auVar23._12_4_ = iVar35;
                      auVar29._4_4_ = iVar34;
                      auVar29._0_4_ = iVar34;
                      auVar29._8_4_ = iVar36;
                      auVar29._12_4_ = iVar36;
                      auVar29 = auVar29 | auVar23 & auVar38;
                      auVar30 = ~auVar29 & auVar26 | auVar30 & auVar29;
                      uVar9 = auVar30._8_4_ | auVar30._0_4_;
                    }
                    else {
                      uVar9 = uVar18 >> (bVar15 - 8 & 0x1f);
                      if ((uVar18 >> ((byte)(bVar15 - 9) & 0x1f) & 1) != 0) {
                        if (0xfd < uVar9) {
                          uVar9 = 0xfe;
                        }
                        uVar9 = uVar9 + 1;
                      }
                    }
                  }
                  *(char *)((long)bufferOut + uVar17) = (char)uVar9;
                }
                else {
                  if (0x1f < uVar2 - 1) goto LAB_0014e3e5;
                  uVar18 = ~(-1 << (bVar15 & 0x1f)) &
                           (uint)(*(ushort *)((long)bufferOut + uVar17 * 2) >>
                                 (0x10 - bVar15 & 0x1f));
                  uVar9 = uVar18;
                  if (uVar2 != 0x10) {
                    if (uVar2 < 0x11) {
                      auVar30._8_8_ = 0;
                      auVar30._0_8_ = uVar16;
                      auVar30 = (ZEXT816(0) << 0x40 | ZEXT816(0xf)) / auVar30;
                      iVar13 = auVar30._0_4_;
                      auVar32 = ZEXT416(uVar2) << 0x40;
                      auVar24._0_8_ = auVar30._0_8_;
                      auVar24._8_4_ = iVar13;
                      auVar24._12_4_ = 0;
                      lVar11 = 2;
                      auVar28 = (undefined1  [16])0x0;
                      do {
                        auVar30 = auVar28;
                        lVar40 = auVar32._8_8_;
                        auVar28._0_8_ =
                             ((ulong)uVar18 << (0x10U - auVar32._0_8_ & 0xffffffff)) >> uVar16;
                        auVar28._8_8_ = ((ulong)uVar18 << (0x10U - lVar40 >> 0x20)) >> uVar16;
                        auVar28 = auVar28 | auVar30;
                        auVar32._0_8_ = auVar32._0_8_ + (ulong)uVar2 * 2;
                        auVar32._8_8_ = lVar40 + (ulong)uVar2 * 2;
                        lVar40 = (ulong)(iVar13 + 2U & 0x1e) + lVar11;
                        lVar11 = lVar11 + -2;
                      } while (lVar40 != 4);
                      lVar11 = -lVar11;
                      auVar31._8_4_ = (int)lVar11;
                      auVar31._0_8_ = lVar11;
                      auVar31._12_4_ = (int)((ulong)lVar11 >> 0x20);
                      auVar24 = auVar24 ^ auVar6;
                      auVar32 = (auVar31 | auVar5) ^ auVar6;
                      iVar13 = -(uint)(auVar24._0_4_ < auVar32._0_4_);
                      iVar34 = -(uint)(auVar24._4_4_ < auVar32._4_4_);
                      iVar35 = -(uint)(auVar24._8_4_ < auVar32._8_4_);
                      iVar36 = -(uint)(auVar24._12_4_ < auVar32._12_4_);
                      auVar39._4_4_ = iVar13;
                      auVar39._0_4_ = iVar13;
                      auVar39._8_4_ = iVar35;
                      auVar39._12_4_ = iVar35;
                      iVar13 = -(uint)(auVar32._4_4_ == auVar24._4_4_);
                      iVar35 = -(uint)(auVar32._12_4_ == auVar24._12_4_);
                      auVar25._4_4_ = iVar13;
                      auVar25._0_4_ = iVar13;
                      auVar25._8_4_ = iVar35;
                      auVar25._12_4_ = iVar35;
                      auVar33._4_4_ = iVar34;
                      auVar33._0_4_ = iVar34;
                      auVar33._8_4_ = iVar36;
                      auVar33._12_4_ = iVar36;
                      auVar33 = auVar33 | auVar25 & auVar39;
                      auVar30 = ~auVar33 & auVar28 | auVar30 & auVar33;
                      uVar9 = auVar30._8_4_ | auVar30._0_4_;
                    }
                    else {
                      uVar9 = uVar18 >> (bVar15 - 0x10 & 0x1f);
                      if ((uVar18 >> (uVar2 - 0x11 & 0x1f) & 1) != 0) {
                        if (0xfffd < uVar9) {
                          uVar9 = 0xfffe;
                        }
                        uVar9 = uVar9 + 1;
                      }
                    }
                  }
                  *(short *)((long)bufferOut + uVar17 * 2) = (short)uVar9;
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar20);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != w);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != h);
    }
  }
  return;
}

Assistant:

void
PngInput::readImage(void* bufferOut, size_t bufferOutByteCount,
                    uint32_t /*subimage*/, uint32_t /*miplevel*/,
                    const FormatDescriptor& format)
{
    const auto& targetFormat = format.isUnknown() ? spec().format() : format;

    const auto channelCount = targetFormat.channelCount();
    const auto height = spec().height();
    const auto width = spec().width();
    const auto targetBitLength = targetFormat.largestChannelBitLength();
    const auto requestBits = std::max(imageio::bit_ceil(targetBitLength), 8u);

    if (requestBits != 8 && requestBits != 16)
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested decode into {}-bit format is not supported.",
                requestBits)
              );

    const bool targetL = targetFormat.samples[0].qualifierLinear;
    const bool targetE = targetFormat.samples[0].qualifierExponent;
    const bool targetS = targetFormat.samples[0].qualifierSigned;
    const bool targetF = targetFormat.samples[0].qualifierFloat;

    // Only UNORM requests are allowed for PNG inputs
    if (targetE || targetL || targetS || targetF)
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.",
                requestBits,
                targetL ? " Linear" : "",
                targetE ? " Exponent" : "",
                targetS ? " Signed" : "",
                targetF ? " Float" : "")
              );

    state.info_raw.bitdepth = requestBits;
    state.info_raw.colortype = [&]{
        switch (targetFormat.channelCount()) {
        case 1:
            return LCT_GREY;
        case 2:
            return LCT_GREY_ALPHA;
        case 3:
            return LCT_RGB;
        case 4:
            return LCT_RGBA;
        }
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested decode into {} channels is not supported.",
                targetFormat.channelCount())
              );
    }();
    auto lodepngError = lodepng_finish_decode(
                                          (unsigned char*)bufferOut,
                                          bufferOutByteCount,
                                          width,
                                          height,
                                          &state,
                                          pIdat,
                                          idatsize);

    if (lodepngError)
        throw std::runtime_error(fmt::format(
                "PNG decode error: {}.", lodepng_error_text(lodepngError)));

    // TODO: Detect endianness
    // if constexpr (std::endian::native == std::endian::little)
    if (requestBits == 16) {
        // LodePNG loads 16 bit channels in big endian order
        auto* data = (unsigned char*) bufferOut;
        for (size_t i = 0; i < bufferOutByteCount; i += 2)
            std::swap(*(data + i), *(data + i + 1));
    }

    if (state.info_png.sbit_defined) {
        // Recalculate the UNORM values based on sBit information to ensure best loading/rounding
        // result regardless of what the png file's writer saved
        std::array<uint32_t, 4> sBits{
            state.info_png.sbit_r,
            state.info_png.sbit_g,
            state.info_png.sbit_b,
            state.info_png.sbit_a,
        };

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < channelCount; ++c) {
                    const auto index = y * width * channelCount + x * channelCount + c;
                    if (requestBits == 8) {
                        auto& value = *(reinterpret_cast<uint8_t*>(bufferOut) + index);
                        value = static_cast<uint8_t>(imageio::convertUNORM(value >> (8 - sBits[c]), sBits[c], 8));
                    } else { // requestBits == 16
                        auto& value = *(reinterpret_cast<uint16_t*>(bufferOut) + index);
                        value = static_cast<uint16_t>(imageio::convertUNORM(value >> (16 - sBits[c]), sBits[c], 16));
                    }
                }
            }
        }
    }
}